

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O1

void MixUpdatePK(DuckDB *db,idx_t thread_idx)

{
  size_type *psVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  result_type rVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer pMVar11;
  size_t __i;
  long lVar12;
  long *plVar13;
  ulong *puVar14;
  unsigned_long uVar15;
  size_t __i_1;
  ulong uVar16;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  string __str_1;
  string __str;
  uniform_int_distribution<int> distribution;
  Connection con;
  mt19937 gen;
  string local_1488;
  long *local_1468;
  ulong *local_1460;
  uint local_1458;
  undefined4 uStack_1454;
  ulong local_1450 [2];
  ulong *local_1440;
  long local_1438;
  ulong local_1430;
  long lStack_1428;
  long *local_1420;
  long local_1418;
  long local_1410;
  long lStack_1408;
  char *local_1400;
  uint local_13f8;
  char local_13f0 [16];
  param_type local_13e0;
  Connection local_13d8 [32];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13e0._M_a = 1;
  local_13e0._M_b = 100;
  lVar12 = 1;
  uVar16 = 0x1571;
  do {
    uVar16 = (ulong)(((uint)(uVar16 >> 0x1e) ^ (uint)uVar16) * 0x6c078965 + (int)lVar12);
    local_13b8._M_x[lVar12] = uVar16;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x270);
  local_13b8._M_x[0] = thread_idx & 0xffffffff;
  lVar12 = 1;
  uVar16 = local_13b8._M_x[0];
  do {
    uVar16 = (ulong)(((uint)(uVar16 >> 0x1e) ^ (uint)uVar16) * 0x6c078965 + (int)lVar12);
    local_13b8._M_x[lVar12] = uVar16;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x270);
  local_13b8._M_p = 0x270;
  duckdb::Connection::Connection(local_13d8,db);
  lVar12 = 0;
  do {
    uVar6 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13e0,&local_13b8,&local_13e0);
    rVar7 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13e0,&local_13b8,&local_13e0);
    uVar8 = rVar7 + 100;
    cVar5 = '\x01';
    if (9 < uVar8) {
      uVar15 = (long)(int)uVar8;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar15 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0043d36c;
        }
        if (uVar15 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0043d36c;
        }
        if (uVar15 < 10000) goto LAB_0043d36c;
        bVar3 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_0043d36c:
    local_1400 = local_13f0;
    std::__cxx11::string::_M_construct((ulong)&local_1400,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_1400,local_13f8,(long)(int)uVar8);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1400,0,(char *)0x0,0x4eb39a);
    local_1420 = &local_1410;
    plVar13 = plVar9 + 2;
    if ((long *)*plVar9 == plVar13) {
      local_1410 = *plVar13;
      lStack_1408 = plVar9[3];
    }
    else {
      local_1410 = *plVar13;
      local_1420 = (long *)*plVar9;
    }
    local_1418 = plVar9[1];
    *plVar9 = (long)plVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1420);
    local_1440 = &local_1430;
    puVar14 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar14) {
      local_1430 = *puVar14;
      lStack_1428 = plVar9[3];
    }
    else {
      local_1430 = *puVar14;
      local_1440 = (ulong *)*plVar9;
    }
    local_1438 = plVar9[1];
    *plVar9 = (long)puVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    cVar5 = '\x01';
    if (9 < uVar6) {
      uVar15 = (long)(int)uVar6;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar15 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0043d4d4;
        }
        if (uVar15 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0043d4d4;
        }
        if (uVar15 < 10000) goto LAB_0043d4d4;
        bVar3 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_0043d4d4:
    local_1460 = local_1450;
    std::__cxx11::string::_M_construct((ulong)&local_1460,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1460,local_1458,(long)(int)uVar6)
    ;
    uVar16 = 0xf;
    if (local_1440 != &local_1430) {
      uVar16 = local_1430;
    }
    uVar2 = CONCAT44(uStack_1454,local_1458) + local_1438;
    if (uVar16 < uVar2) {
      uVar16 = 0xf;
      if (local_1460 != local_1450) {
        uVar16 = local_1450[0];
      }
      if (uVar16 < uVar2) goto LAB_0043d547;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1460,0,(char *)0x0,(ulong)local_1440);
    }
    else {
LAB_0043d547:
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1440,(ulong)local_1460)
      ;
    }
    local_1488._M_dataplus._M_p = (pointer)&local_1488.field_2;
    psVar1 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_1488.field_2._M_allocated_capacity = *psVar1;
      local_1488.field_2._8_8_ = puVar10[3];
    }
    else {
      local_1488.field_2._M_allocated_capacity = *psVar1;
      local_1488._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1488._M_string_length = puVar10[1];
    *puVar10 = psVar1;
    puVar10[1] = 0;
    *(undefined1 *)psVar1 = 0;
    duckdb::Connection::Query((string *)&local_1468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1488._M_dataplus._M_p != &local_1488.field_2) {
      operator_delete(local_1488._M_dataplus._M_p);
    }
    if (local_1460 != local_1450) {
      operator_delete(local_1460);
    }
    if (local_1440 != &local_1430) {
      operator_delete(local_1440);
    }
    if (local_1420 != &local_1410) {
      operator_delete(local_1420);
    }
    if (local_1400 != local_13f0) {
      operator_delete(local_1400);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_1468);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (cVar5 != '\0') {
      pMVar11 = duckdb::
                unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                              *)&local_1468);
      (**(code **)(*(long *)pMVar11 + 0x20))(&local_1488,pMVar11);
      CheckConstraintViolation(&local_1488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1488._M_dataplus._M_p != &local_1488.field_2) {
        operator_delete(local_1488._M_dataplus._M_p);
      }
    }
    if (local_1468 != (long *)0x0) {
      (**(code **)(*local_1468 + 8))();
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 100) {
      duckdb::Connection::~Connection(local_13d8);
      return;
    }
  } while( true );
}

Assistant:

static void MixUpdatePK(DuckDB *db, idx_t thread_idx) {

	std::uniform_int_distribution<> distribution(1, 100);
	std::mt19937 gen;
	gen.seed(thread_idx);

	Connection con(*db);
	for (idx_t i = 0; i < 100; i++) {

		idx_t old_value = distribution(gen);
		idx_t new_value = 100 + distribution(gen);

		auto result =
		    con.Query("UPDATE integers SET i =" + to_string(new_value) + " WHERE i = " + to_string(old_value));
		if (result->HasError()) {
			CheckConstraintViolation(result->ToString());
		}
	}
}